

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

void __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToNextInterpreterExecutionMode
          (FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode mode;
  ExecutionState state;
  undefined4 *puVar3;
  FunctionExecutionStateMachine *this_00;
  
  bVar2 = IsInterpreterExecutionMode(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x26a,"(IsInterpreterExecutionMode())",
                                "IsInterpreterExecutionMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  TryTransitionToNextExecutionMode(this);
  this_00 = this;
  mode = GetInterpreterExecutionMode(this,false);
  state = ModeToState(this_00,mode);
  SetExecutionState(this,state);
  return;
}

Assistant:

void FunctionExecutionStateMachine::TryTransitionToNextInterpreterExecutionMode()
    {
        Assert(IsInterpreterExecutionMode());

        TryTransitionToNextExecutionMode();
        SetExecutionState(ModeToState(GetInterpreterExecutionMode(false)));
    }